

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O3

StatusOr<long> * __thiscall
google::protobuf::util::converter::(anonymous_namespace)::ValidateNumberConversion<long,float>
          (StatusOr<long> *__return_storage_ptr__,_anonymous_namespace_ *this,long after,
          float before)

{
  StringPiece error_message;
  StatusOr<long> *pSVar1;
  StatusOr<long> *extraout_RAX;
  int iVar2;
  float fVar3;
  StringPiece error_message_00;
  undefined1 local_90 [32];
  Status local_70;
  Status local_48;
  
  if (((float)(long)this == before) && (!NAN((float)(long)this) && !NAN(before))) {
    fVar3 = before;
    if (before != 0.0) {
      fVar3 = *(float *)(&DAT_00353280 + (ulong)(0.0 < before) * 4);
    }
    iVar2 = ((0 < (long)this) - 1) + (uint)(0 < (long)this);
    if (this == (_anonymous_namespace_ *)0x0) {
      iVar2 = 0;
    }
    if ((fVar3 == (float)iVar2) && (!NAN(fVar3) && !NAN((float)iVar2))) {
      Status::Status(&__return_storage_ptr__->status_);
      pSVar1 = (StatusOr<long> *)
               Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
      __return_storage_ptr__->value_ = (long)this;
      return pSVar1;
    }
  }
  FloatAsString_abi_cxx11_((string *)local_90,(converter *)this,before);
  error_message.length_ = local_90._8_8_;
  error_message.ptr_ = (char *)local_90._0_8_;
  if ((long)local_90._8_8_ < 0) {
    StringPiece::LogFatalSizeTooBig(local_90._8_8_,"size_t to int conversion");
  }
  Status::Status(&local_48,INVALID_ARGUMENT,error_message);
  Status::Status(&__return_storage_ptr__->status_);
  if (local_48.error_code_ == OK) {
    error_message_00.length_ = 0x23;
    error_message_00.ptr_ = "Status::OK is not a valid argument.";
    Status::Status(&local_70,INTERNAL,error_message_00);
    Status::operator=(&__return_storage_ptr__->status_,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.error_message_._M_dataplus._M_p != &local_70.error_message_.field_2) {
      operator_delete(local_70.error_message_._M_dataplus._M_p);
    }
  }
  else {
    Status::operator=(&__return_storage_ptr__->status_,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.error_message_._M_dataplus._M_p != &local_48.error_message_.field_2) {
    operator_delete(local_48.error_message_._M_dataplus._M_p);
  }
  pSVar1 = (StatusOr<long> *)(local_90 + 0x10);
  if ((StatusOr<long> *)local_90._0_8_ != pSVar1) {
    operator_delete((void *)local_90._0_8_);
    pSVar1 = extraout_RAX;
  }
  return pSVar1;
}

Assistant:

StatusOr<To> ValidateNumberConversion(To after, From before) {
  if (after == before &&
      MathUtil::Sign<From>(before) == MathUtil::Sign<To>(after)) {
    return after;
  } else {
    return InvalidArgument(std::is_integral<From>::value
                               ? ValueAsString(before)
                               : std::is_same<From, double>::value
                                     ? DoubleAsString(before)
                                     : FloatAsString(before));
  }
}